

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O3

size_t loadVarint(LoadState *S,size_t limit)

{
  byte bVar1;
  ulong uVar2;
  
  uVar2 = 0;
  do {
    bVar1 = loadByte(S);
    if (limit >> 7 < uVar2) {
      error(S,"integer overflow");
    }
    uVar2 = (ulong)(bVar1 & 0x7f) | uVar2 << 7;
  } while ((char)bVar1 < '\0');
  return uVar2;
}

Assistant:

static size_t loadVarint (LoadState *S, size_t limit) {
  size_t x = 0;
  int b;
  limit >>= 7;
  do {
    b = loadByte(S);
    if (x > limit)
      error(S, "integer overflow");
    x = (x << 7) | (b & 0x7f);
  } while ((b & 0x80) != 0);
  return x;
}